

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::couvscc::
generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::
empty_stacks(generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
             *this)

{
  if ((this->_todo).c.
      super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->_todo).c.
      super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
      ::pop_back(&(this->_todo).c);
    } while ((this->_todo).c.
             super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->_todo).c.
             super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if ((this->_roots).c.
      super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->_roots).c.
      super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
      ::pop_back(&(this->_roots).c);
    } while ((this->_roots).c.
             super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->_roots).c.
             super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if ((this->_active).c.
      super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->_active).c.
      super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
      ::pop_back(&(this->_active).c);
    } while ((this->_active).c.
             super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->_active).c.
             super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  return;
}

Assistant:

void empty_stacks()
  {
    while (!_todo.empty())
      _todo.pop();
    while (!_roots.empty())
      _roots.pop();
    while (!_active.empty())
      _active.pop();
  }